

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O3

void __thiscall Json_Whitespace_Test::TestBody(Json_Whitespace_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 auVar3 [8];
  _Alloc_hider _Var4;
  parser<json_out_callbacks> *ppVar5;
  long *plVar6;
  coord *pcVar7;
  size_type *psVar8;
  coord cVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  char *pcVar11;
  char *in_R9;
  pointer *__ptr;
  string res_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> lf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> keyword;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> crlf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cr;
  undefined1 local_2d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined1 local_2b8 [8];
  coord local_2b0;
  long local_2a8;
  coord cStack_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  result_type local_278;
  undefined1 local_258 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  undefined1 local_218 [32];
  undefined1 local_1f8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  result_type local_1d8;
  parser<json_out_callbacks> local_1b8;
  json_out_callbacks local_100;
  json_out_callbacks local_e0;
  json_out_callbacks local_c0;
  json_out_callbacks local_a0;
  json_out_callbacks local_80;
  json_out_callbacks local_60;
  span<const_char,__1L> local_40;
  
  paVar2 = &local_60.out_.field_2;
  local_60.out_.field_2._M_allocated_capacity = 0;
  local_60.out_.field_2._8_8_ = 0;
  local_60.out_._M_string_length = 0;
  local_60.out_._M_dataplus._M_p = (pointer)paVar2;
  pstore::json::parser<json_out_callbacks>::parser(&local_1b8,&local_60,none);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.out_._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.out_._M_dataplus._M_p,local_60.out_.field_2._M_allocated_capacity + 1);
  }
  local_248._M_allocated_capacity = 0x2020202009202020;
  local_248._8_4_ = 0x6c6c756e;
  local_250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000c;
  local_248._M_local_buf[0xc] = '\0';
  local_258 = (undefined1  [8])&local_248;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)local_1f8,0xc);
  local_1f0 = &local_248;
  ppVar5 = pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
                     (&local_1b8,(span<const_char,__1L> *)local_1f8);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_1d8,ppVar5);
  if (local_258 != (undefined1  [8])&local_248) {
    operator_delete((void *)local_258,local_248._M_allocated_capacity + 1);
  }
  local_1f8[0] = local_1b8.error_._M_value == 0;
  local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  if (local_1b8.error_._M_value != 0) {
    testing::Message::Message((Message *)&local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_258,(internal *)local_1f8,(AssertionResult *)"p1.has_error ()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x47,(char *)local_258);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_278,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_278);
    if (local_258 != (undefined1  [8])&local_248) {
      operator_delete((void *)local_258,local_248._M_allocated_capacity + 1);
    }
    if ((long *)local_238._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_238._M_dataplus._M_p + 8))();
    }
    if (local_1f0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0);
    }
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)local_258,"res","\"null\"",&local_1d8,(char (*) [5])0x18a61d);
  if (local_258[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_250 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_250->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x48,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((coord)local_1f8 != (coord)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  if (local_250 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_250,local_250);
  }
  local_1f8._0_4_ = local_1b8.coordinate_.column;
  local_1f8._4_4_ = local_1b8.coordinate_.row;
  local_238._M_dataplus._M_p = (pointer)0x10000000d;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)local_258,"p1.coordinate ()","(json::coord{13U, 1U})",(coord *)local_1f8,
             (coord *)&local_238);
  if (local_258[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_250 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_250->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x49,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((coord)local_1f8 != (coord)0x0) {
      (**(code **)(*(size_type *)local_1f8 + 8))();
    }
  }
  if (local_250 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_250,local_250);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT62(local_1d8.field_2._M_allocated_capacity._2_6_,
                             local_1d8.field_2._M_allocated_capacity._0_2_) + 1);
  }
  paVar2 = &local_1b8.string_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.string_._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b8.string_._M_dataplus._M_p,
                    local_1b8.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.callbacks_.out_._M_dataplus._M_p != &local_1b8.callbacks_.out_.field_2) {
    operator_delete(local_1b8.callbacks_.out_._M_dataplus._M_p,
                    local_1b8.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_1b8.stack_.c);
  if (local_1b8.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_1b8.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  local_1d8.field_2._M_allocated_capacity._0_2_ = 0xd;
  local_1d8._M_string_length = 1;
  local_248._M_allocated_capacity._0_2_ = 10;
  local_250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_258 = (undefined1  [8])&local_248;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                 &local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  local_238.field_2._M_allocated_capacity._0_4_ = 0x6c6c756e;
  local_238._M_string_length = 4;
  local_238.field_2._M_allocated_capacity._4_4_ =
       local_238.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  paVar1 = &local_80.out_.field_2;
  local_80.out_.field_2._M_allocated_capacity = 0;
  local_80.out_.field_2._8_8_ = 0;
  local_80.out_._M_string_length = 0;
  local_80.out_._M_dataplus._M_p = (pointer)paVar1;
  pstore::json::parser<json_out_callbacks>::parser(&local_1b8,&local_80,none);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.out_._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.out_._M_dataplus._M_p,local_80.out_.field_2._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258);
  plVar6 = (long *)std::__cxx11::string::_M_append(local_2d8,(ulong)local_238._M_dataplus._M_p);
  paVar1 = &local_278.field_2;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_278.field_2._M_allocated_capacity = *psVar8;
    local_278.field_2._8_8_ = plVar6[3];
    local_278._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_278.field_2._M_allocated_capacity = *psVar8;
    local_278._M_dataplus._M_p = (pointer)*plVar6;
  }
  _Var4._M_p = local_278._M_dataplus._M_p;
  local_278._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)local_2b8,local_278._M_string_length);
  local_2b0 = (coord)_Var4._M_p;
  pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
            (&local_1b8,(span<const_char,__1L> *)local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if (local_2d8 != (undefined1  [8])&local_2c8) {
    operator_delete((void *)local_2d8,local_2c8._M_allocated_capacity + 1);
  }
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_278,&local_1b8);
  local_2b8[0] = local_1b8.error_._M_value == 0;
  local_2b0 = (coord)0x0;
  if (local_1b8.error_._M_value != 0) {
    testing::Message::Message((Message *)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2d8,(internal *)local_2b8,(AssertionResult *)"p2.has_error ()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x56,(char *)local_2d8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_218,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
    if (local_2d8 != (undefined1  [8])&local_2c8) {
      operator_delete((void *)local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if ((long *)local_298._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_298._M_dataplus._M_p + 8))();
    }
    if (local_2b0 != (coord)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_2b8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
    }
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_2d8,"res","keyword",&local_278,&local_238);
  if (local_2d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2b8);
    if (local_2d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x57,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((coord)local_2b8 != (coord)0x0) {
      (**(code **)(*(long *)local_2b8 + 8))();
    }
  }
  if (local_2d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d0,local_2d0);
  }
  local_2b8._0_4_ = local_1b8.coordinate_.column;
  local_2b8._4_4_ = local_1b8.coordinate_.row;
  local_298._M_dataplus._M_p = &DAT_300000005;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)local_2d8,"p2.coordinate ()","(json::coord{xord, 3U})",(coord *)local_2b8,
             (coord *)&local_298);
  if (local_2d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2b8);
    if (local_2d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x58,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((coord)local_2b8 != (coord)0x0) {
      (**(code **)(*(size_type *)local_2b8 + 8))();
    }
  }
  if (local_2d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d0,local_2d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.string_._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b8.string_._M_dataplus._M_p,
                    local_1b8.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.callbacks_.out_._M_dataplus._M_p != &local_1b8.callbacks_.out_.field_2) {
    operator_delete(local_1b8.callbacks_.out_._M_dataplus._M_p,
                    local_1b8.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_1b8.stack_.c);
  if (local_1b8.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_1b8.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  paVar10 = &local_a0.out_.field_2;
  local_a0.out_.field_2._M_allocated_capacity = 0;
  local_a0.out_.field_2._8_8_ = 0;
  local_a0.out_._M_string_length = 0;
  local_a0.out_._M_dataplus._M_p = (pointer)paVar10;
  pstore::json::parser<json_out_callbacks>::parser(&local_1b8,&local_a0,none);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.out_._M_dataplus._M_p != paVar10) {
    operator_delete(local_a0.out_._M_dataplus._M_p,local_a0.out_.field_2._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                 &local_1d8,&local_1d8);
  plVar6 = (long *)std::__cxx11::string::_M_append(local_2d8,(ulong)local_238._M_dataplus._M_p);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_278.field_2._M_allocated_capacity = *psVar8;
    local_278.field_2._8_8_ = plVar6[3];
    local_278._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_278.field_2._M_allocated_capacity = *psVar8;
    local_278._M_dataplus._M_p = (pointer)*plVar6;
  }
  _Var4._M_p = local_278._M_dataplus._M_p;
  local_278._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)local_2b8,local_278._M_string_length);
  local_2b0 = (coord)_Var4._M_p;
  pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
            (&local_1b8,(span<const_char,__1L> *)local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if (local_2d8 != (undefined1  [8])&local_2c8) {
    operator_delete((void *)local_2d8,local_2c8._M_allocated_capacity + 1);
  }
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_278,&local_1b8);
  local_2b8[0] = local_1b8.error_._M_value == 0;
  local_2b0 = (coord)0x0;
  if (local_1b8.error_._M_value != 0) {
    testing::Message::Message((Message *)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2d8,(internal *)local_2b8,(AssertionResult *)"p3.has_error ()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x5e,(char *)local_2d8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_218,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
    if (local_2d8 != (undefined1  [8])&local_2c8) {
      operator_delete((void *)local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if ((long *)local_298._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_298._M_dataplus._M_p + 8))();
    }
    if (local_2b0 != (coord)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_2b8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
    }
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_2d8,"res","keyword",&local_278,&local_238);
  if (local_2d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2b8);
    if (local_2d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x5f,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((coord)local_2b8 != (coord)0x0) {
      (**(code **)(*(long *)local_2b8 + 8))();
    }
  }
  if (local_2d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d0,local_2d0);
  }
  local_2b8._0_4_ = local_1b8.coordinate_.column;
  local_2b8._4_4_ = local_1b8.coordinate_.row;
  local_298._M_dataplus._M_p = &DAT_300000005;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)local_2d8,"p3.coordinate ()","(json::coord{xord, 3U})",(coord *)local_2b8,
             (coord *)&local_298);
  if (local_2d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2b8);
    if (local_2d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x60,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((coord)local_2b8 != (coord)0x0) {
      (**(code **)(*(size_type *)local_2b8 + 8))();
    }
  }
  if (local_2d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d0,local_2d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.string_._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b8.string_._M_dataplus._M_p,
                    local_1b8.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.callbacks_.out_._M_dataplus._M_p != &local_1b8.callbacks_.out_.field_2) {
    operator_delete(local_1b8.callbacks_.out_._M_dataplus._M_p,
                    local_1b8.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_1b8.stack_.c);
  if (local_1b8.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_1b8.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  paVar10 = &local_c0.out_.field_2;
  local_c0.out_.field_2._M_allocated_capacity = 0;
  local_c0.out_.field_2._8_8_ = 0;
  local_c0.out_._M_string_length = 0;
  local_c0.out_._M_dataplus._M_p = (pointer)paVar10;
  pstore::json::parser<json_out_callbacks>::parser(&local_1b8,&local_c0,none);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.out_._M_dataplus._M_p != paVar10) {
    operator_delete(local_c0.out_._M_dataplus._M_p,local_c0.out_.field_2._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
  plVar6 = (long *)std::__cxx11::string::_M_append(local_2d8,(ulong)local_238._M_dataplus._M_p);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_278.field_2._M_allocated_capacity = *psVar8;
    local_278.field_2._8_8_ = plVar6[3];
    local_278._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_278.field_2._M_allocated_capacity = *psVar8;
    local_278._M_dataplus._M_p = (pointer)*plVar6;
  }
  _Var4._M_p = local_278._M_dataplus._M_p;
  local_278._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)local_2b8,local_278._M_string_length);
  local_2b0 = (coord)_Var4._M_p;
  pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
            (&local_1b8,(span<const_char,__1L> *)local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if (local_2d8 != (undefined1  [8])&local_2c8) {
    operator_delete((void *)local_2d8,local_2c8._M_allocated_capacity + 1);
  }
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_278,&local_1b8);
  local_2b8[0] = local_1b8.error_._M_value == 0;
  local_2b0 = (coord)0x0;
  if (local_1b8.error_._M_value != 0) {
    testing::Message::Message((Message *)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2d8,(internal *)local_2b8,(AssertionResult *)"p4.has_error ()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x66,(char *)local_2d8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_218,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
    if (local_2d8 != (undefined1  [8])&local_2c8) {
      operator_delete((void *)local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if ((long *)local_298._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_298._M_dataplus._M_p + 8))();
    }
    if (local_2b0 != (coord)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_2b8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
    }
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_2d8,"res","keyword",&local_278,&local_238);
  if (local_2d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2b8);
    if (local_2d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x67,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((coord)local_2b8 != (coord)0x0) {
      (**(code **)(*(long *)local_2b8 + 8))();
    }
  }
  if (local_2d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d0,local_2d0);
  }
  local_2b8._0_4_ = local_1b8.coordinate_.column;
  local_2b8._4_4_ = local_1b8.coordinate_.row;
  local_298._M_dataplus._M_p = &DAT_300000005;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)local_2d8,"p4.coordinate ()","(json::coord{xord, 3U})",(coord *)local_2b8,
             (coord *)&local_298);
  if (local_2d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2b8);
    if (local_2d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x68,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((coord)local_2b8 != (coord)0x0) {
      (**(code **)(*(size_type *)local_2b8 + 8))();
    }
  }
  if (local_2d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d0,local_2d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.string_._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b8.string_._M_dataplus._M_p,
                    local_1b8.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.callbacks_.out_._M_dataplus._M_p != &local_1b8.callbacks_.out_.field_2) {
    operator_delete(local_1b8.callbacks_.out_._M_dataplus._M_p,
                    local_1b8.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_1b8.stack_.c);
  if (local_1b8.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_1b8.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  paVar2 = &local_e0.out_.field_2;
  local_e0.out_.field_2._M_allocated_capacity = 0;
  local_e0.out_.field_2._8_8_ = 0;
  local_e0.out_._M_string_length = 0;
  local_e0.out_._M_dataplus._M_p = (pointer)paVar2;
  pstore::json::parser<json_out_callbacks>::parser(&local_1b8,&local_e0,none);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.out_._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0.out_._M_dataplus._M_p,local_e0.out_.field_2._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                 &local_1d8);
  plVar6 = (long *)std::__cxx11::string::_M_append(local_218,(ulong)local_258);
  paVar2 = &local_298.field_2;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_298.field_2._M_allocated_capacity = *psVar8;
    local_298.field_2._8_8_ = plVar6[3];
    local_298._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_298.field_2._M_allocated_capacity = *psVar8;
    local_298._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_298._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pcVar7 = (coord *)std::__cxx11::string::_M_append
                              ((char *)&local_298,(ulong)local_1d8._M_dataplus._M_p);
  cVar9 = (coord)(pcVar7 + 2);
  if (*pcVar7 == cVar9) {
    local_2a8 = *(long *)cVar9;
    cStack_2a0 = pcVar7[3];
    local_2b8 = (undefined1  [8])&local_2a8;
  }
  else {
    local_2a8 = *(long *)cVar9;
    local_2b8 = (undefined1  [8])*pcVar7;
  }
  local_2b0 = pcVar7[1];
  *pcVar7 = cVar9;
  pcVar7[1].column = 0;
  pcVar7[1].row = 0;
  *(undefined1 *)&pcVar7[2].column = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append(local_2b8,(ulong)local_238._M_dataplus._M_p);
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar10) {
    local_2c8._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2c8._8_8_ = plVar6[3];
    local_2d8 = (undefined1  [8])&local_2c8;
  }
  else {
    local_2c8._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2d8 = (undefined1  [8])*plVar6;
  }
  auVar3 = local_2d8;
  local_2d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar6[1];
  *plVar6 = (long)paVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)&local_40,(index_type)local_2d0);
  local_40.storage_.data_ = (pointer)auVar3;
  ppVar5 = pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
                     (&local_1b8,&local_40);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_278,ppVar5);
  if (local_2d8 != (undefined1  [8])&local_2c8) {
    operator_delete((void *)local_2d8,local_2c8._M_allocated_capacity + 1);
  }
  if (local_2b8 != (undefined1  [8])&local_2a8) {
    operator_delete((void *)local_2b8,local_2a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((AssertHelperData *)local_218._0_8_ != (AssertHelperData *)(local_218 + 0x10)) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
  }
  local_2b8[0] = local_1b8.error_._M_value == 0;
  local_2b0 = (coord)0x0;
  if (local_1b8.error_._M_value != 0) {
    testing::Message::Message((Message *)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2d8,(internal *)local_2b8,(AssertionResult *)"p5.has_error ()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x6f,(char *)local_2d8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_218,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
    if (local_2d8 != (undefined1  [8])&local_2c8) {
      operator_delete((void *)local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_298._M_dataplus._M_p + 8))();
    }
    if (local_2b0 != (coord)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_2b8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
    }
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_2d8,"res","keyword",&local_278,&local_238);
  if (local_2d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2b8);
    if (local_2d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x70,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((coord)local_2b8 != (coord)0x0) {
      (**(code **)(*(long *)local_2b8 + 8))();
    }
  }
  if (local_2d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d0,local_2d0);
  }
  local_2b8._0_4_ = local_1b8.coordinate_.column;
  local_2b8._4_4_ = local_1b8.coordinate_.row;
  local_298._M_dataplus._M_p = &DAT_400000005;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)local_2d8,"p5.coordinate ()","(json::coord{xord, 4U})",(coord *)local_2b8,
             (coord *)&local_298);
  if (local_2d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2b8);
    if (local_2d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x71,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((coord)local_2b8 != (coord)0x0) {
      (**(code **)(*(size_type *)local_2b8 + 8))();
    }
  }
  if (local_2d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d0,local_2d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.string_._M_dataplus._M_p != &local_1b8.string_.field_2) {
    operator_delete(local_1b8.string_._M_dataplus._M_p,
                    local_1b8.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.callbacks_.out_._M_dataplus._M_p != &local_1b8.callbacks_.out_.field_2) {
    operator_delete(local_1b8.callbacks_.out_._M_dataplus._M_p,
                    local_1b8.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_1b8.stack_.c);
  if (local_1b8.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_1b8.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  paVar10 = &local_100.out_.field_2;
  local_100.out_.field_2._M_allocated_capacity = 0;
  local_100.out_.field_2._8_8_ = 0;
  local_100.out_._M_string_length = 0;
  local_100.out_._M_dataplus._M_p = (pointer)paVar10;
  pstore::json::parser<json_out_callbacks>::parser(&local_1b8,&local_100,none);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.out_._M_dataplus._M_p != paVar10) {
    operator_delete(local_100.out_._M_dataplus._M_p,local_100.out_.field_2._M_allocated_capacity + 1
                   );
  }
  std::operator+(&local_298,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258);
  pcVar7 = (coord *)std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_1f8);
  cVar9 = (coord)(pcVar7 + 2);
  if (*pcVar7 == cVar9) {
    local_2a8 = *(long *)cVar9;
    cStack_2a0 = pcVar7[3];
    local_2b8 = (undefined1  [8])&local_2a8;
  }
  else {
    local_2a8 = *(long *)cVar9;
    local_2b8 = (undefined1  [8])*pcVar7;
  }
  local_2b0 = pcVar7[1];
  *pcVar7 = cVar9;
  pcVar7[1].column = 0;
  pcVar7[1].row = 0;
  *(undefined1 *)&pcVar7[2].column = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append(local_2b8,(ulong)local_1d8._M_dataplus._M_p);
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar10) {
    local_2c8._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2c8._8_8_ = plVar6[3];
    local_2d8 = (undefined1  [8])&local_2c8;
  }
  else {
    local_2c8._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2d8 = (undefined1  [8])*plVar6;
  }
  local_2d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar6[1];
  *plVar6 = (long)paVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append(local_2d8,(ulong)local_238._M_dataplus._M_p);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_278.field_2._M_allocated_capacity = *psVar8;
    local_278.field_2._8_8_ = plVar6[3];
    local_278._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_278.field_2._M_allocated_capacity = *psVar8;
    local_278._M_dataplus._M_p = (pointer)*plVar6;
  }
  _Var4._M_p = local_278._M_dataplus._M_p;
  local_278._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)local_218,local_278._M_string_length);
  local_218._8_8_ = _Var4._M_p;
  pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
            (&local_1b8,(span<const_char,__1L> *)local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if (local_2d8 != (undefined1  [8])&local_2c8) {
    operator_delete((void *)local_2d8,local_2c8._M_allocated_capacity + 1);
  }
  if (local_2b8 != (undefined1  [8])&local_2a8) {
    operator_delete((void *)local_2b8,local_2a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_278,&local_1b8);
  local_2b8[0] = local_1b8.error_._M_value == 0;
  local_2b0 = (coord)0x0;
  if (local_1b8.error_._M_value != 0) {
    testing::Message::Message((Message *)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2d8,(internal *)local_2b8,(AssertionResult *)"p6.has_error ()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x77,(char *)local_2d8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_218,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
    if (local_2d8 != (undefined1  [8])&local_2c8) {
      operator_delete((void *)local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if ((long *)local_298._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_298._M_dataplus._M_p + 8))();
    }
    if (local_2b0 != (coord)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_2b8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
    }
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)local_2d8,"res","\"null\"",&local_278,(char (*) [5])0x18a61d);
  if (local_2d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2b8);
    if (local_2d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x78,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((coord)local_2b8 != (coord)0x0) {
      (**(code **)(*(long *)local_2b8 + 8))();
    }
  }
  if (local_2d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d0,local_2d0);
  }
  local_2b8._0_4_ = local_1b8.coordinate_.column;
  local_2b8._4_4_ = local_1b8.coordinate_.row;
  local_298._M_dataplus._M_p = (pointer)0x500000005;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)local_2d8,"p6.coordinate ()","(json::coord{xord, 5U})",(coord *)local_2b8,
             (coord *)&local_298);
  if (local_2d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2b8);
    if (local_2d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x79,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((coord)local_2b8 != (coord)0x0) {
      (**(code **)(*(size_type *)local_2b8 + 8))();
    }
  }
  if (local_2d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d0,local_2d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.string_._M_dataplus._M_p != &local_1b8.string_.field_2) {
    operator_delete(local_1b8.string_._M_dataplus._M_p,
                    local_1b8.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.callbacks_.out_._M_dataplus._M_p != &local_1b8.callbacks_.out_.field_2) {
    operator_delete(local_1b8.callbacks_.out_._M_dataplus._M_p,
                    local_1b8.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_1b8.stack_.c);
  if ((__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )local_1b8.singletons_._M_t.
        super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
        .
        super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_1b8.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,
                    CONCAT44(local_238.field_2._M_allocated_capacity._4_4_,
                             local_238.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_1f8 != (undefined1  [8])&local_1e8) {
    operator_delete((void *)local_1f8,local_1e8._M_allocated_capacity + 1);
  }
  if (local_258 != (undefined1  [8])&local_248) {
    operator_delete((void *)local_258,local_248._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT62(local_1d8.field_2._M_allocated_capacity._2_6_,
                             local_1d8.field_2._M_allocated_capacity._0_2_) + 1);
  }
  return;
}

Assistant:

TEST_F (Json, Whitespace) {
    {
        json::parser<json_out_callbacks> p1;
        std::string const res = p1.input ("   \t    null"s).eof ();
        EXPECT_FALSE (p1.has_error ());
        EXPECT_EQ (res, "null");
        EXPECT_EQ (p1.coordinate (), (json::coord{13U, 1U}));
    }

    auto const cr = "\r"s;
    auto const lf = "\n"s;
    auto const crlf = cr + lf;
    auto const keyword = "null"s;
    auto const xord = static_cast<unsigned> (keyword.length ()) + 1U;

    {
        json::parser<json_out_callbacks> p2;
        p2.input (lf + lf + keyword); // POSIX-style line endings
        std::string const res = p2.eof ();
        EXPECT_FALSE (p2.has_error ());
        EXPECT_EQ (res, keyword);
        EXPECT_EQ (p2.coordinate (), (json::coord{xord, 3U}));
    }
    {
        json::parser<json_out_callbacks> p3;
        p3.input (cr + cr + keyword); // MacOS Classic line endings
        std::string const res = p3.eof ();
        EXPECT_FALSE (p3.has_error ());
        EXPECT_EQ (res, keyword);
        EXPECT_EQ (p3.coordinate (), (json::coord{xord, 3U}));
    }
    {
        json::parser<json_out_callbacks> p4;
        p4.input (crlf + crlf + keyword); // Windows-style CRLF
        std::string const res = p4.eof ();
        EXPECT_FALSE (p4.has_error ());
        EXPECT_EQ (res, keyword);
        EXPECT_EQ (p4.coordinate (), (json::coord{xord, 3U}));
    }
    {
        json::parser<json_out_callbacks> p5;
        // Nobody's line-endings. Each counts as a new line. Note that the middle cr+lf pair will
        // match a single Windows crlf.
        std::string const res = p5.input (lf + cr + lf + cr + keyword).eof ();
        EXPECT_FALSE (p5.has_error ());
        EXPECT_EQ (res, keyword);
        EXPECT_EQ (p5.coordinate (), (json::coord{xord, 4U}));
    }
    {
        json::parser<json_out_callbacks> p6;
        p6.input (lf + lf + crlf + cr + keyword); // A groovy mixture of line-ending characters.
        std::string const res = p6.eof ();
        EXPECT_FALSE (p6.has_error ());
        EXPECT_EQ (res, "null");
        EXPECT_EQ (p6.coordinate (), (json::coord{xord, 5U}));
    }
}